

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_superalphabet_vector(uchar **strings,size_t n)

{
  iterator __position;
  ulong uVar1;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *node;
  pointer ppvVar2;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *this_00;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar3;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  size_t sVar4;
  uint index;
  size_t depth;
  long lVar6;
  ushort uVar7;
  uchar *str;
  BurstSimple<unsigned_short> local_49;
  uchar *local_48;
  uchar **local_40;
  size_t local_38;
  _func_void_uchar_ptr_ptr_int_int *p_Var5;
  
  local_40 = strings;
  node = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)operator_new(0x18);
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = n;
  if (n != 0) {
    sVar4 = 0;
    do {
      local_48 = local_40[sVar4];
      if (local_48 == (uchar *)0x0) {
LAB_0020f96b:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_48 == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = CONCAT11(*local_48,local_48[1]);
      }
      p_Var5 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar7;
      index = (uint)uVar7;
      ppvVar2 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
               ((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3);
      depth = 2;
      this = node;
      if (p_Var5 < in_RCX) {
        lVar6 = 0;
        do {
          if (((ulong)ppvVar2[(long)p_Var5] & 1) == 0) break;
          if ((char)uVar7 == '\0') {
            __assert_fail("not is_end(c)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xeb,
                          "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                         );
          }
          this = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                 ::get_node(this,(uint)p_Var5);
          if (local_48 == (uchar *)0x0) goto LAB_0020f96b;
          if (local_48[lVar6 + 2] == '\0') {
            uVar7 = 0;
          }
          else {
            uVar7 = CONCAT11(local_48[lVar6 + 2],local_48[lVar6 + 3]);
          }
          p_Var5 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar7;
          ppvVar2 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3);
          lVar6 = lVar6 + 2;
        } while (p_Var5 < in_RCX);
        index = (uint)p_Var5;
        depth = lVar6 + 2;
      }
      this_00 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                ::get_bucket(this,index);
      if (this_00 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        __assert_fail("bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xf1,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      __position._M_current = *(uchar ***)(this_00 + 8);
      if (__position._M_current == *(uchar ***)(this_00 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(this_00,__position,&local_48);
      }
      else {
        *__position._M_current = local_48;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      if (((char)uVar7 != '\0') && (0x40000 < (ulong)(*(long *)(this_00 + 8) - *(long *)this_00))) {
        pTVar3 = BurstSimple<unsigned_short>::operator()
                           (&local_49,
                            (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this_00,
                            depth);
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar7;
        *(TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          **)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)((uint)uVar7 * 8)) = pTVar3;
        ppvVar2 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar1 = *(ulong *)((long)ppvVar2 + (ulong)((uint)uVar7 * 8));
        if (uVar1 == 0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x5c,"void make_trie(void *&)");
        }
        ppvVar2[(long)in_RCX] = (void *)(uVar1 | 1);
        if (*(void **)this_00 != (void *)0x0) {
          operator_delete(*(void **)this_00);
        }
        operator_delete(this_00);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != local_38);
  }
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
            (node,local_40,0,in_RCX);
  return;
}

Assistant:

void burstsort2_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}